

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O0

void __thiscall Clasp::PropagatorList::add(PropagatorList *this,PostPropagator *p)

{
  PostPropagator *pPVar1;
  uint uVar2;
  uint uVar3;
  PostPropagator *in_RSI;
  PropagatorList *in_RDI;
  PostPropagator *x;
  PostPropagator **r;
  uint32 prio;
  PostPropagator **local_20;
  
  if ((in_RSI == (PostPropagator *)0x0) || (in_RSI->next != (PostPropagator *)0x0)) {
    Potassco::fail(-2,"void Clasp::PropagatorList::add(PostPropagator *)",0x4a,"p && p->next == 0",
                   "Invalid post propagator",0);
  }
  uVar2 = (*(in_RSI->super_Constraint)._vptr_Constraint[0x12])();
  local_20 = head(in_RDI);
  while (pPVar1 = *local_20, pPVar1 != (PostPropagator *)0x0) {
    uVar3 = (*(pPVar1->super_Constraint)._vptr_Constraint[0x12])();
    if (uVar2 < uVar3) break;
    local_20 = &pPVar1->next;
  }
  in_RSI->next = pPVar1;
  *local_20 = in_RSI;
  return;
}

Assistant:

void PropagatorList::add(PostPropagator* p) {
	POTASSCO_REQUIRE(p && p->next == 0, "Invalid post propagator");
	uint32 prio = p->priority();
	for (PostPropagator** r = head(), *x;; r = &x->next) {
		if ((x = *r) == 0 || prio < (uint32)x->priority()) {
			p->next = x;
			*r      = p;
			break;
		}
	}
}